

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O0

void adios2::helper::IOYAML(ADIOS *adios,Node *ioMap,IO *io,string *hint)

{
  bool bVar1;
  iterator_value *in_RDX;
  string *in_stack_00000028;
  IO *in_stack_00000030;
  string type_1;
  Params parameters_1;
  const_iterator it;
  Node transportsSequence;
  Node *variableMap;
  const_iterator __end3;
  const_iterator __begin3;
  Node *__range3;
  Node variablesSequence;
  string type;
  iterator itType;
  Params parameters;
  Node engineMap;
  iterator_base<const_YAML::detail::iterator_value> *in_stack_fffffffffffff928;
  iterator_value *in_stack_fffffffffffff930;
  iterator_value *in_stack_fffffffffffff968;
  IO *in_stack_fffffffffffff970;
  iterator in_stack_fffffffffffff978;
  string local_668 [16];
  Node *in_stack_fffffffffffff9a8;
  allocator local_641;
  string local_640 [32];
  string local_620 [168];
  iterator_base<const_YAML::detail::iterator_value> *in_stack_fffffffffffffa88;
  string local_510 [64];
  Params *in_stack_fffffffffffffb30;
  string *in_stack_fffffffffffffb38;
  IO *in_stack_fffffffffffffb40;
  value in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  string *in_stack_fffffffffffffb58;
  Node *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb68;
  allocator local_429;
  string local_428 [199];
  allocator local_361;
  string *in_stack_fffffffffffffca0;
  Node *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffd80;
  IO *in_stack_fffffffffffffd88;
  Node *in_stack_fffffffffffffd90;
  allocator local_1c9;
  string local_1c8 [96];
  string local_168 [39];
  undefined1 local_141 [33];
  string local_120 [32];
  _Self local_100;
  allocator local_f1;
  string local_f0 [32];
  _Self local_d0 [9];
  allocator local_81;
  string local_80 [104];
  iterator_value *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Engine",&local_81);
  anon_unknown_0::YAMLNode
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (bool)in_stack_fffffffffffffb57,in_stack_fffffffffffffb50);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  bVar1 = YAML::Node::operator_cast_to_bool((Node *)0x9d721b);
  if (bVar1) {
    anon_unknown_0::YAMLNodeMapToParams(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Type",&local_f1);
    in_stack_fffffffffffff978 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff928,(key_type *)0x9d728f);
    local_d0[0]._M_node = in_stack_fffffffffffff978._M_node;
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    local_100._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff928);
    bVar1 = std::operator!=(local_d0,&local_100);
    if (bVar1) {
      in_stack_fffffffffffff970 = (IO *)local_141;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_141 + 1),"Type",(allocator *)in_stack_fffffffffffff970);
      EraseKey<std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff978._M_node,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff970);
      std::__cxx11::string::~string((string *)(local_141 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_141);
      in_stack_fffffffffffff968 = local_18;
      std::__cxx11::string::string(local_168,local_120);
      core::IO::SetEngine(in_stack_00000030,in_stack_00000028);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_120);
    }
    core::IO::SetParameters(in_stack_fffffffffffff970,(Params *)in_stack_fffffffffffff968);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x9d74e1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"Variables",&local_1c9);
  anon_unknown_0::YAMLNode
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (bool)in_stack_fffffffffffffb57,in_stack_fffffffffffffb50);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  bVar1 = YAML::Node::operator_cast_to_bool((Node *)0x9d7579);
  if (bVar1) {
    YAML::Node::begin(in_stack_fffffffffffff9a8);
    YAML::Node::end(in_stack_fffffffffffff9a8);
    while (bVar1 = YAML::detail::iterator_base<YAML::detail::iterator_value_const>::operator!=
                             ((iterator_base<const_YAML::detail::iterator_value> *)
                              in_stack_fffffffffffff930,in_stack_fffffffffffff928), bVar1) {
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                (in_stack_fffffffffffffa88);
      IOVariableYAML(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      YAML::detail::iterator_value::~iterator_value(in_stack_fffffffffffff930);
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator++
                ((iterator_base<const_YAML::detail::iterator_value> *)in_stack_fffffffffffff930);
    }
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
              ((iterator_base<const_YAML::detail::iterator_value> *)0x9d7602);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
              ((iterator_base<const_YAML::detail::iterator_value> *)0x9d760f);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffca0,"Transports",&local_361);
  anon_unknown_0::YAMLNode
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (bool)in_stack_fffffffffffffb57,in_stack_fffffffffffffb50);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffca0);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  bVar1 = YAML::Node::operator_cast_to_bool((Node *)0x9d77d5);
  if (bVar1) {
    YAML::Node::begin(in_stack_fffffffffffff9a8);
    while( true ) {
      YAML::Node::end(in_stack_fffffffffffff9a8);
      bVar1 = YAML::detail::iterator_base<YAML::detail::iterator_value_const>::operator!=
                        ((iterator_base<const_YAML::detail::iterator_value> *)
                         in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
                ((iterator_base<const_YAML::detail::iterator_value> *)0x9d7840);
      if (!bVar1) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_428,"Type",&local_429);
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                (in_stack_fffffffffffffa88);
      std::operator+((char *)in_stack_fffffffffffff978._M_node,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff970);
      anon_unknown_0::YAMLNode
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                 (bool)in_stack_fffffffffffffb57,in_stack_fffffffffffffb50);
      YAML::Node::~Node(&in_stack_fffffffffffff930->super_Node);
      std::__cxx11::string::~string(local_510);
      YAML::detail::iterator_value::~iterator_value(in_stack_fffffffffffff930);
      std::__cxx11::string::~string(local_428);
      std::allocator<char>::~allocator((allocator<char> *)&local_429);
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                (in_stack_fffffffffffffa88);
      anon_unknown_0::YAMLNodeMapToParams(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      YAML::detail::iterator_value::~iterator_value(in_stack_fffffffffffff930);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_640,"Type",&local_641);
      EraseKey<std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff978._M_node,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff970);
      std::__cxx11::string::~string(local_640);
      std::allocator<char>::~allocator((allocator<char> *)&local_641);
      in_stack_fffffffffffff930 = local_18;
      std::__cxx11::string::string(local_668,local_620);
      core::IO::AddTransport
                (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_668);
      std::__cxx11::string::~string(local_620);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x9d7adc);
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator++
                ((iterator_base<const_YAML::detail::iterator_value> *)in_stack_fffffffffffff930);
    }
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
              ((iterator_base<const_YAML::detail::iterator_value> *)0x9d7859);
  }
  YAML::Node::~Node(&in_stack_fffffffffffff930->super_Node);
  YAML::Node::~Node(&in_stack_fffffffffffff930->super_Node);
  YAML::Node::~Node(&in_stack_fffffffffffff930->super_Node);
  return;
}

Assistant:

void IOYAML(core::ADIOS &adios, const YAML::Node &ioMap, core::IO &io, const std::string &hint)
{
    // Engine parameters
    const YAML::Node engineMap = YAMLNode("Engine", ioMap, hint, false, YAML::NodeType::Map);

    if (engineMap)
    {
        Params parameters = YAMLNodeMapToParams(engineMap, hint);
        auto itType = parameters.find("Type");
        if (itType != parameters.end())
        {
            const std::string type = EraseKey<std::string>("Type", parameters);
            io.SetEngine(type);
        }
        io.SetParameters(parameters);
    }

    // Variables
    const YAML::Node variablesSequence =
        YAMLNode("Variables", ioMap, hint, false, YAML::NodeType::Sequence);

    if (variablesSequence)
    {
        // loop through each variable node
        for (const YAML::Node &variableMap : variablesSequence)
        {
            IOVariableYAML(variableMap, io, hint);
        }
    }

    // Transports
    const YAML::Node transportsSequence =
        YAMLNode("Transports", ioMap, hint, false, YAML::NodeType::Sequence);

    if (transportsSequence)
    {
        // loop through each transport node
        for (auto it = transportsSequence.begin(); it != transportsSequence.end(); ++it)
        {
            YAMLNode("Type", *it, " in transport node " + hint, isMandatory,
                     YAML::NodeType::Scalar);

            Params parameters = YAMLNodeMapToParams(*it, hint);
            const std::string type = EraseKey<std::string>("Type", parameters);

            io.AddTransport(type, parameters);
        }
    }
}